

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsummaryxreftobin.cpp
# Opt level: O0

void doit(void)

{
  int iVar1;
  char *pcVar2;
  uint local_101c;
  char local_1018 [4];
  int lineno;
  char line [4096];
  undefined1 auStack_10 [4];
  fmsummaryxref s;
  
  fgets(local_1018,0x1000,_stdin);
  local_101c = 1;
  while( true ) {
    pcVar2 = fgets(local_1018,0x1000,_stdin);
    if (pcVar2 == (char *)0x0) {
      return;
    }
    iVar1 = __isoc99_sscanf(local_1018,"%d,%d,%d",line + 0xffc,auStack_10,&s);
    if (iVar1 != 3) break;
    fwrite(line + 0xffc,0xc,1,_stdout);
    local_101c = local_101c + 1;
  }
  fprintf(_stderr,"Invalid data in line %d:\n%s",(ulong)local_101c,local_1018);
  return;
}

Assistant:

void doit()
{

	fmsummaryxref s;
    char line[4096];
    int lineno=0;
	fgets(line, sizeof(line), stdin);
	lineno++;
    while (fgets(line, sizeof(line), stdin) != 0)
    {
		if (sscanf(line, "%d,%d,%d", &s.output_id, &s.summary_id, &s.summaryset_id) != 3){
           fprintf(stderr, "Invalid data in line %d:\n%s", lineno, line);
           return;
       }

	    else
       {
           fwrite(&s, sizeof(s), 1, stdout);
       }
       lineno++;
    }

}